

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_info.cpp
# Opt level: O2

void __thiscall duckdb::CreateInfo::CopyProperties(CreateInfo *this,CreateInfo *other)

{
  (other->super_ParseInfo).field_0x9 = (this->super_ParseInfo).field_0x9;
  ::std::__cxx11::string::_M_assign((string *)&other->catalog);
  ::std::__cxx11::string::_M_assign((string *)&other->schema);
  other->on_conflict = this->on_conflict;
  other->temporary = this->temporary;
  other->internal = this->internal;
  ::std::__cxx11::string::_M_assign((string *)&other->sql);
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::operator=((_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)&other->dependencies,
              (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)&this->dependencies);
  Value::operator=(&other->comment,&this->comment);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&other->tags,&(this->tags)._M_h);
  return;
}

Assistant:

void CreateInfo::CopyProperties(CreateInfo &other) const {
	other.type = type;
	other.catalog = catalog;
	other.schema = schema;
	other.on_conflict = on_conflict;
	other.temporary = temporary;
	other.internal = internal;
	other.sql = sql;
	other.dependencies = dependencies;
	other.comment = comment;
	other.tags = tags;
}